

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

Slice __thiscall leveldb::Version::LevelFileNumIterator::key(LevelFileNumIterator *this)

{
  FileMetaData *pFVar1;
  size_type sVar2;
  int iVar3;
  Slice SVar4;
  
  iVar3 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar3 == '\0') {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0xbe,"virtual Slice leveldb::Version::LevelFileNumIterator::key() const");
  }
  pFVar1 = (this->flist_->
           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
           _M_impl.super__Vector_impl_data._M_start[this->index_];
  sVar2 = (pFVar1->largest).rep_._M_string_length;
  if (sVar2 != 0) {
    SVar4.size_ = sVar2;
    SVar4.data_ = (pFVar1->largest).rep_._M_dataplus._M_p;
    return SVar4;
  }
  __assert_fail("!rep_.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/dbformat.h"
                ,0x96,"Slice leveldb::InternalKey::Encode() const");
}

Assistant:

Slice key() const override {
    assert(Valid());
    return (*flist_)[index_]->largest.Encode();
  }